

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O0

void __thiscall Manifold_InvalidInput4_Test::TestBody(Manifold_InvalidInput4_Test *this)

{
  bool bVar1;
  byte bVar2;
  pointer *this_00;
  reference puVar3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_1a8;
  Message local_1a0;
  Error local_198;
  Error local_194;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  Manifold local_128 [8];
  Manifold tet;
  uint32_t *triVert;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  MeshGL in;
  Manifold_InvalidInput4_Test *this_local;
  
  in._224_8_ = this;
  TetGL();
  this_00 = &in.vertProperties.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  triVert = (uint32_t *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&triVert), bVar1) {
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    if (*puVar3 == 2) {
      *puVar3 = 4;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  manifold::Manifold::Manifold(local_128,(MeshGLP *)&__range1);
  bVar2 = manifold::Manifold::IsEmpty();
  local_149 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_148,(AssertionResult *)"tet.IsEmpty()"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_194 = manifold::Manifold::Status();
  local_198 = NotManifold;
  testing::internal::EqHelper::
  Compare<manifold::Manifold::Error,_manifold::Manifold::Error,_nullptr>
            ((EqHelper *)local_190,"tet.Status()","Manifold::Error::NotManifold",&local_194,
             &local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  manifold::Manifold::~Manifold(local_128);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&__range1);
  return;
}

Assistant:

TEST(Manifold, InvalidInput4) {
  MeshGL in = TetGL();
  for (uint32_t& triVert : in.triVerts) {
    if (triVert == 2) triVert = 4;
  }
  Manifold tet(in);
  EXPECT_TRUE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::NotManifold);
}